

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O0

Conjuncts *
BuildConjuncts(DdManager *dd,DdNode *node,st__table *distanceTable,st__table *cacheTable,
              int approxDistance,int maxLocalRef,st__table *ghTable,st__table *mintermTable)

{
  DdNode *pDVar1;
  Conjuncts *pCVar2;
  int iVar3;
  undefined8 *puVar4;
  ulong uVar5;
  Conjuncts *local_100;
  Conjuncts *local_f8;
  int local_e4;
  int *piStack_e0;
  int value;
  NodeStat *nodeStat;
  uint local_d0;
  int freeTemp;
  int freeNnv;
  int freeNv;
  int outOfMem;
  int switched;
  double *doubleDummy;
  double minNnv;
  double minNv;
  DdNode *topv;
  DdNode *h2;
  DdNode *h1;
  DdNode *g2;
  DdNode *g1;
  DdNode *temp;
  DdNode *Nnv;
  DdNode *Nv;
  DdNode *N;
  Conjuncts *dummy;
  Conjuncts *factors;
  Conjuncts *factorsNnv;
  Conjuncts *factorsNv;
  int distance;
  int topid;
  int maxLocalRef_local;
  int approxDistance_local;
  st__table *cacheTable_local;
  st__table *distanceTable_local;
  DdNode *node_local;
  DdManager *dd_local;
  
  factorsNnv = (Conjuncts *)0x0;
  factors = (Conjuncts *)0x0;
  minNnv = 0.0;
  doubleDummy = (double *)0x0;
  freeNv = 0;
  freeTemp = 0;
  local_d0 = 0;
  distance = maxLocalRef;
  topid = approxDistance;
  _maxLocalRef_local = cacheTable;
  cacheTable_local = distanceTable;
  distanceTable_local = (st__table *)node;
  node_local = &dd->sentinel;
  if (*(int *)((ulong)node & 0xfffffffffffffffe) == 0x7fffffff) {
    puVar4 = (undefined8 *)malloc(0x10);
    if (puVar4 == (undefined8 *)0x0) {
      *(undefined4 *)((long)&node_local[0xf].type + 8) = 1;
      dd_local = (DdManager *)0x0;
    }
    else {
      *puVar4 = distanceTable_local;
      puVar4[1] = distanceTable_local;
      dd_local = (DdManager *)((ulong)puVar4 | 1);
    }
  }
  else {
    iVar3 = st__lookup(cacheTable,(char *)node,(char **)&N);
    if (iVar3 == 0) {
      Nv = (DdNode *)((ulong)distanceTable_local & 0xfffffffffffffffe);
      iVar3 = st__lookup(cacheTable_local,(char *)Nv,(char **)&stack0xffffffffffffff20);
      if (iVar3 == 0) {
        fprintf((FILE *)node_local[0xf].type.kids.T,"Not in table, Something wrong\n");
        *(undefined4 *)((long)&node_local[0xf].type + 8) = 5;
        dd_local = (DdManager *)0x0;
      }
      else {
        factorsNv._0_4_ = *piStack_e0;
        if ((((distance << 1) / 3 < piStack_e0[1]) && ((int)factorsNv < (topid << 1) / 3)) ||
           ((int)factorsNv <= topid / 4)) {
          dummy = (Conjuncts *)malloc(0x10);
          if (dummy == (Conjuncts *)0x0) {
            *(undefined4 *)((long)&node_local[0xf].type + 8) = 1;
            dd_local = (DdManager *)0x0;
          }
          else {
            local_e4 = 0;
            iVar3 = st__lookup_int(ghTable,(char *)((ulong)distanceTable_local & 0xfffffffffffffffe)
                                   ,&local_e4);
            if (iVar3 == 0) {
              if (lastTimeG == 0) {
                dummy->g = (DdNode *)distanceTable_local;
                dummy->h = one;
                lastTimeG = 1;
                local_e4 = 1;
                iVar3 = st__insert(ghTable,(char *)((ulong)distanceTable_local & 0xfffffffffffffffe)
                                   ,(char *)0x1);
                if (iVar3 == -10000) {
                  *(undefined4 *)((long)&node_local[0xf].type + 8) = 1;
                  if (dummy != (Conjuncts *)0x0) {
                    free(dummy);
                  }
                  return (Conjuncts *)0x0;
                }
              }
              else {
                dummy->g = one;
                dummy->h = (DdNode *)distanceTable_local;
                lastTimeG = 0;
                local_e4 = 2;
                iVar3 = st__insert(ghTable,(char *)((ulong)distanceTable_local & 0xfffffffffffffffe)
                                   ,(char *)0x2);
                if (iVar3 == -10000) {
                  *(undefined4 *)((long)&node_local[0xf].type + 8) = 1;
                  if (dummy != (Conjuncts *)0x0) {
                    free(dummy);
                  }
                  return (Conjuncts *)0x0;
                }
              }
            }
            else if (local_e4 == 3) {
              if (lastTimeG != 0) {
                dummy->g = one;
                dummy->h = (DdNode *)distanceTable_local;
              }
              else {
                dummy->g = (DdNode *)distanceTable_local;
                dummy->h = one;
              }
              lastTimeG = (long)(lastTimeG == 0);
            }
            else if (local_e4 == 1) {
              dummy->g = (DdNode *)distanceTable_local;
              dummy->h = one;
            }
            else {
              dummy->g = one;
              dummy->h = (DdNode *)distanceTable_local;
            }
            dd_local = (DdManager *)((ulong)dummy | 1);
          }
        }
        else {
          Nnv = (DdNode *)((ulong)(Nv->type).kids.T ^ (long)(int)((uint)distanceTable_local & 1));
          temp = (DdNode *)((ulong)(Nv->type).kids.E ^ (long)(int)((uint)distanceTable_local & 1));
          if (*(int *)((ulong)Nnv & 0xfffffffffffffffe) != 0x7fffffff) {
            iVar3 = st__lookup(mintermTable,(char *)Nnv,(char **)&outOfMem);
            if (iVar3 == 0) {
              fprintf((FILE *)node_local[0xf].type.kids.T,"Not in table: Something wrong\n");
              *(undefined4 *)((long)&node_local[0xf].type + 8) = 5;
              return (Conjuncts *)0x0;
            }
            minNnv = *_outOfMem;
          }
          if (*(int *)((ulong)temp & 0xfffffffffffffffe) != 0x7fffffff) {
            iVar3 = st__lookup(mintermTable,(char *)temp,(char **)&outOfMem);
            if (iVar3 == 0) {
              fprintf((FILE *)node_local[0xf].type.kids.T,"Not in table: Something wrong\n");
              *(undefined4 *)((long)&node_local[0xf].type + 8) = 5;
              return (Conjuncts *)0x0;
            }
            doubleDummy = (double *)*_outOfMem;
          }
          pDVar1 = Nnv;
          if (minNnv < (double)doubleDummy) {
            g1 = Nnv;
            Nnv = temp;
            temp = pDVar1;
            freeNv = 1;
          }
          if (Nnv != zero) {
            local_f8 = BuildConjuncts((DdManager *)node_local,Nnv,cacheTable_local,
                                      _maxLocalRef_local,topid,distance,ghTable,mintermTable);
            if (local_f8 == (Conjuncts *)0x0) {
              return (Conjuncts *)0x0;
            }
            freeTemp = (uint)local_f8 & 1;
            if (((ulong)local_f8 & 1) != 0) {
              local_f8 = (Conjuncts *)((ulong)local_f8 ^ 1);
            }
            factorsNnv = local_f8;
            uVar5 = (ulong)local_f8->g & 0xfffffffffffffffe;
            *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + 1;
            uVar5 = (ulong)local_f8->h & 0xfffffffffffffffe;
            *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + 1;
            if (temp == zero) {
              dummy = ZeroCase((DdManager *)node_local,(DdNode *)distanceTable_local,local_f8,
                               ghTable,_maxLocalRef_local,freeNv);
              if ((freeTemp != 0) && (factorsNnv != (Conjuncts *)0x0)) {
                free(factorsNnv);
              }
              return dummy;
            }
          }
          if (temp != zero) {
            local_100 = BuildConjuncts((DdManager *)node_local,temp,cacheTable_local,
                                       _maxLocalRef_local,topid,distance,ghTable,mintermTable);
            if (local_100 == (Conjuncts *)0x0) {
              factors = local_100;
              Cudd_RecursiveDeref((DdManager *)node_local,factorsNnv->g);
              Cudd_RecursiveDeref((DdManager *)node_local,factorsNnv->h);
              if ((freeTemp != 0) && (factorsNnv != (Conjuncts *)0x0)) {
                free(factorsNnv);
              }
              return (Conjuncts *)0x0;
            }
            local_d0 = (uint)local_100 & 1;
            if (((ulong)local_100 & 1) != 0) {
              local_100 = (Conjuncts *)((ulong)local_100 ^ 1);
            }
            factors = local_100;
            uVar5 = (ulong)local_100->g & 0xfffffffffffffffe;
            *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + 1;
            uVar5 = (ulong)local_100->h & 0xfffffffffffffffe;
            *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + 1;
            if (Nnv == zero) {
              dummy = ZeroCase((DdManager *)node_local,(DdNode *)distanceTable_local,local_100,
                               ghTable,_maxLocalRef_local,freeNv);
              if ((local_d0 != 0) && (factors != (Conjuncts *)0x0)) {
                free(factors);
              }
              return dummy;
            }
          }
          pCVar2 = factors;
          iVar3 = freeTemp;
          if (freeNv != 0) {
            dummy = factors;
            factors = factorsNnv;
            factorsNnv = pCVar2;
            nodeStat._4_4_ = freeTemp;
            freeTemp = local_d0;
            local_d0 = iVar3;
          }
          factorsNv._4_4_ = Nv->index;
          minNv = *(double *)(&(node_local[8].type.kids.E)->index + (long)(int)factorsNv._4_4_ * 2);
          g2 = cuddBddIteRecur((DdManager *)node_local,(DdNode *)minNv,factorsNnv->g,factors->g);
          if (g2 == (DdNode *)0x0) {
            Cudd_RecursiveDeref((DdManager *)node_local,factorsNnv->g);
            Cudd_RecursiveDeref((DdManager *)node_local,factorsNnv->h);
            Cudd_RecursiveDeref((DdManager *)node_local,factors->g);
            Cudd_RecursiveDeref((DdManager *)node_local,factors->h);
            if ((freeTemp != 0) && (factorsNnv != (Conjuncts *)0x0)) {
              free(factorsNnv);
              factorsNnv = (Conjuncts *)0x0;
            }
            if ((local_d0 != 0) && (factors != (Conjuncts *)0x0)) {
              free(factors);
            }
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)g2 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)g2 & 0xfffffffffffffffe) + 4) + 1;
            h2 = cuddBddIteRecur((DdManager *)node_local,(DdNode *)minNv,factorsNnv->h,factors->h);
            if (h2 == (DdNode *)0x0) {
              Cudd_RecursiveDeref((DdManager *)node_local,factorsNnv->g);
              Cudd_RecursiveDeref((DdManager *)node_local,factorsNnv->h);
              Cudd_RecursiveDeref((DdManager *)node_local,factors->g);
              Cudd_RecursiveDeref((DdManager *)node_local,factors->h);
              Cudd_RecursiveDeref((DdManager *)node_local,g2);
              if ((freeTemp != 0) && (factorsNnv != (Conjuncts *)0x0)) {
                free(factorsNnv);
                factorsNnv = (Conjuncts *)0x0;
              }
              if ((local_d0 != 0) && (factors != (Conjuncts *)0x0)) {
                free(factors);
              }
              dd_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)h2 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)h2 & 0xfffffffffffffffe) + 4) + 1;
              h1 = cuddBddIteRecur((DdManager *)node_local,(DdNode *)minNv,factorsNnv->g,factors->h)
              ;
              if (h1 == (DdNode *)0x0) {
                Cudd_RecursiveDeref((DdManager *)node_local,factorsNnv->h);
                Cudd_RecursiveDeref((DdManager *)node_local,factorsNnv->g);
                Cudd_RecursiveDeref((DdManager *)node_local,factors->g);
                Cudd_RecursiveDeref((DdManager *)node_local,factors->h);
                Cudd_RecursiveDeref((DdManager *)node_local,g2);
                Cudd_RecursiveDeref((DdManager *)node_local,h2);
                if ((freeTemp != 0) && (factorsNnv != (Conjuncts *)0x0)) {
                  free(factorsNnv);
                  factorsNnv = (Conjuncts *)0x0;
                }
                if ((local_d0 != 0) && (factors != (Conjuncts *)0x0)) {
                  free(factors);
                }
                dd_local = (DdManager *)0x0;
              }
              else {
                *(int *)(((ulong)h1 & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)h1 & 0xfffffffffffffffe) + 4) + 1;
                Cudd_RecursiveDeref((DdManager *)node_local,factorsNnv->g);
                Cudd_RecursiveDeref((DdManager *)node_local,factors->h);
                topv = cuddBddIteRecur((DdManager *)node_local,(DdNode *)minNv,factorsNnv->h,
                                       factors->g);
                if (topv == (DdNode *)0x0) {
                  Cudd_RecursiveDeref((DdManager *)node_local,factorsNnv->g);
                  Cudd_RecursiveDeref((DdManager *)node_local,factorsNnv->h);
                  Cudd_RecursiveDeref((DdManager *)node_local,factors->g);
                  Cudd_RecursiveDeref((DdManager *)node_local,factors->h);
                  Cudd_RecursiveDeref((DdManager *)node_local,g2);
                  Cudd_RecursiveDeref((DdManager *)node_local,h2);
                  Cudd_RecursiveDeref((DdManager *)node_local,h1);
                  if ((freeTemp != 0) && (factorsNnv != (Conjuncts *)0x0)) {
                    free(factorsNnv);
                    factorsNnv = (Conjuncts *)0x0;
                  }
                  if ((local_d0 != 0) && (factors != (Conjuncts *)0x0)) {
                    free(factors);
                  }
                  dd_local = (DdManager *)0x0;
                }
                else {
                  *(int *)(((ulong)topv & 0xfffffffffffffffe) + 4) =
                       *(int *)(((ulong)topv & 0xfffffffffffffffe) + 4) + 1;
                  Cudd_RecursiveDeref((DdManager *)node_local,factorsNnv->h);
                  Cudd_RecursiveDeref((DdManager *)node_local,factors->g);
                  if ((freeTemp != 0) && (factorsNnv != (Conjuncts *)0x0)) {
                    free(factorsNnv);
                    factorsNnv = (Conjuncts *)0x0;
                  }
                  if ((local_d0 != 0) && (factors != (Conjuncts *)0x0)) {
                    free(factors);
                    factors = (Conjuncts *)0x0;
                  }
                  dummy = CheckInTables((DdNode *)distanceTable_local,g2,h2,h1,topv,ghTable,
                                        _maxLocalRef_local,&freeNnv);
                  if (freeNnv == 0) {
                    if (dummy == (Conjuncts *)0x0) {
                      dummy = PickOnePair((DdNode *)distanceTable_local,g2,h2,h1,topv,ghTable,
                                          _maxLocalRef_local);
                      if (dummy == (Conjuncts *)0x0) {
                        *(undefined4 *)((long)&node_local[0xf].type + 8) = 1;
                        Cudd_RecursiveDeref((DdManager *)node_local,g2);
                        Cudd_RecursiveDeref((DdManager *)node_local,h2);
                        Cudd_RecursiveDeref((DdManager *)node_local,h1);
                        Cudd_RecursiveDeref((DdManager *)node_local,topv);
                      }
                      else if ((dummy->g == g2) || (dummy->g == h2)) {
                        Cudd_RecursiveDeref((DdManager *)node_local,h1);
                        Cudd_RecursiveDeref((DdManager *)node_local,topv);
                      }
                      else {
                        Cudd_RecursiveDeref((DdManager *)node_local,g2);
                        Cudd_RecursiveDeref((DdManager *)node_local,h2);
                      }
                      dd_local = (DdManager *)dummy;
                    }
                    else {
                      if ((dummy->g == g2) || (dummy->g == h2)) {
                        Cudd_RecursiveDeref((DdManager *)node_local,h1);
                        Cudd_RecursiveDeref((DdManager *)node_local,topv);
                      }
                      else {
                        Cudd_RecursiveDeref((DdManager *)node_local,g2);
                        Cudd_RecursiveDeref((DdManager *)node_local,h2);
                      }
                      dd_local = (DdManager *)dummy;
                    }
                  }
                  else {
                    *(undefined4 *)((long)&node_local[0xf].type + 8) = 1;
                    Cudd_RecursiveDeref((DdManager *)node_local,g2);
                    Cudd_RecursiveDeref((DdManager *)node_local,h2);
                    Cudd_RecursiveDeref((DdManager *)node_local,h1);
                    Cudd_RecursiveDeref((DdManager *)node_local,topv);
                    dd_local = (DdManager *)0x0;
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      dd_local = (DdManager *)N;
    }
  }
  return (Conjuncts *)dd_local;
}

Assistant:

static Conjuncts *
BuildConjuncts(
  DdManager * dd,
  DdNode * node,
  st__table * distanceTable,
  st__table * cacheTable,
  int approxDistance,
  int maxLocalRef,
  st__table * ghTable,
  st__table * mintermTable)
{
    int topid, distance;
    Conjuncts *factorsNv = NULL, *factorsNnv = NULL, *factors;
    Conjuncts *dummy;
    DdNode *N, *Nv, *Nnv, *temp, *g1, *g2, *h1, *h2, *topv;
    double minNv = 0.0, minNnv = 0.0;
    double *doubleDummy;
    int switched =0;
    int outOfMem;
    int freeNv = 0, freeNnv = 0, freeTemp;
    NodeStat *nodeStat;
    int value;

    /* if f is constant, return (f,f) */
    if (Cudd_IsConstant(node)) {
        factors = ABC_ALLOC(Conjuncts, 1);
        if (factors == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(NULL);
        }
        factors->g = node;
        factors->h = node;
        return(FactorsComplement(factors));
    }

    /* If result (a pair of conjuncts) in cache, return the factors. */
    if ( st__lookup(cacheTable, (const char *)node, (char **)&dummy)) {
        factors = dummy;
        return(factors);
    }
    
    /* check distance and local reference count of this node */
    N = Cudd_Regular(node);
    if (! st__lookup(distanceTable, (const char *)N, (char **)&nodeStat)) {
        (void) fprintf(dd->err, "Not in table, Something wrong\n");
        dd->errorCode = CUDD_INTERNAL_ERROR;
        return(NULL);
    }
    distance = nodeStat->distance;

    /* at or below decomposition point, return (f, 1) */
    if (((nodeStat->localRef > maxLocalRef*2/3) &&
         (distance < approxDistance*2/3)) ||
            (distance <= approxDistance/4)) {
        factors = ABC_ALLOC(Conjuncts, 1);
        if (factors == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(NULL);
        }
        /* alternate assigning (f,1) */
        value = 0;
        if ( st__lookup_int(ghTable, (char *)Cudd_Regular(node), &value)) {
            if (value == 3) {
                if (!lastTimeG) {
                    factors->g = node;
                    factors->h = one;
                    lastTimeG = 1;
                } else {
                    factors->g = one;
                    factors->h = node;
                    lastTimeG = 0; 
                }
            } else if (value == 1) {
                factors->g = node;
                factors->h = one;
            } else {
                factors->g = one;
                factors->h = node;
            }
        } else if (!lastTimeG) {
            factors->g = node;
            factors->h = one;
            lastTimeG = 1;
            value = 1;
            if ( st__insert(ghTable, (char *)Cudd_Regular(node), (char *)(long)value) == st__OUT_OF_MEM) {
                dd->errorCode = CUDD_MEMORY_OUT;
                ABC_FREE(factors);
                return NULL;
            }
        } else {
            factors->g = one;
            factors->h = node;
            lastTimeG = 0;
            value = 2;
            if ( st__insert(ghTable, (char *)Cudd_Regular(node), (char *)(long)value) == st__OUT_OF_MEM) {
                dd->errorCode = CUDD_MEMORY_OUT;
                ABC_FREE(factors);
                return NULL;
            }
        }
        return(FactorsComplement(factors));
    }
    
    /* get the children and recur */
    Nv = cuddT(N);
    Nnv = cuddE(N);
    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    /* Choose which subproblem to solve first based on the number of
     * minterms. We go first where there are more minterms.
     */
    if (!Cudd_IsConstant(Nv)) {
        if (! st__lookup(mintermTable, (const char *)Nv, (char **)&doubleDummy)) {
            (void) fprintf(dd->err, "Not in table: Something wrong\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
        }
        minNv = *doubleDummy;
    }
    
    if (!Cudd_IsConstant(Nnv)) {
        if (! st__lookup(mintermTable, (const char *)Nnv, (char **)&doubleDummy)) {
            (void) fprintf(dd->err, "Not in table: Something wrong\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
        }
        minNnv = *doubleDummy;
    }
    
    if (minNv < minNnv) {
        temp = Nv;
        Nv = Nnv;
        Nnv = temp;
        switched = 1;
    }

    /* build gt, ht recursively */
    if (Nv != zero) {
        factorsNv = BuildConjuncts(dd, Nv, distanceTable,
                                   cacheTable, approxDistance, maxLocalRef, 
                                   ghTable, mintermTable);
        if (factorsNv == NULL) return(NULL);
        freeNv = FactorsNotStored(factorsNv);
        factorsNv = (freeNv) ? FactorsUncomplement(factorsNv) : factorsNv;
        cuddRef(factorsNv->g);
        cuddRef(factorsNv->h);
        
        /* Deal with the zero case */
        if (Nnv == zero) {
            /* is responsible for freeing factorsNv */
            factors = ZeroCase(dd, node, factorsNv, ghTable,
                               cacheTable, switched);
            if (freeNv) ABC_FREE(factorsNv);
            return(factors);
        }
    }

    /* build ge, he recursively */
    if (Nnv != zero) {
        factorsNnv = BuildConjuncts(dd, Nnv, distanceTable,
                                    cacheTable, approxDistance, maxLocalRef,
                                    ghTable, mintermTable);
        if (factorsNnv == NULL) {
            Cudd_RecursiveDeref(dd, factorsNv->g);
            Cudd_RecursiveDeref(dd, factorsNv->h);
            if (freeNv) ABC_FREE(factorsNv);
            return(NULL);
        }
        freeNnv = FactorsNotStored(factorsNnv);
        factorsNnv = (freeNnv) ? FactorsUncomplement(factorsNnv) : factorsNnv;
        cuddRef(factorsNnv->g);
        cuddRef(factorsNnv->h);
        
        /* Deal with the zero case */
        if (Nv == zero) {
            /* is responsible for freeing factorsNv */
            factors = ZeroCase(dd, node, factorsNnv, ghTable,
                               cacheTable, switched);
            if (freeNnv) ABC_FREE(factorsNnv);
            return(factors);
        }
    }

    /* construct the 2 pairs */
    /* g1 = x*gt + x'*ge; h1 = x*ht + x'*he; */
    /* g2 = x*gt + x'*he; h2 = x*ht + x'*ge */
    if (switched) {
        factors = factorsNnv;
        factorsNnv = factorsNv;
        factorsNv = factors;
        freeTemp = freeNv;
        freeNv = freeNnv;
        freeNnv = freeTemp;
    }

    /* Build the factors for this node. */
    topid = N->index;
    topv = dd->vars[topid];
    
    g1 = cuddBddIteRecur(dd, topv, factorsNv->g, factorsNnv->g);
    if (g1 == NULL) {
        Cudd_RecursiveDeref(dd, factorsNv->g);
        Cudd_RecursiveDeref(dd, factorsNv->h);
        Cudd_RecursiveDeref(dd, factorsNnv->g);
        Cudd_RecursiveDeref(dd, factorsNnv->h);
        if (freeNv) ABC_FREE(factorsNv);
        if (freeNnv) ABC_FREE(factorsNnv);
        return(NULL);
    }

    cuddRef(g1);

    h1 = cuddBddIteRecur(dd, topv, factorsNv->h, factorsNnv->h);
    if (h1 == NULL) {
        Cudd_RecursiveDeref(dd, factorsNv->g);
        Cudd_RecursiveDeref(dd, factorsNv->h);
        Cudd_RecursiveDeref(dd, factorsNnv->g);
        Cudd_RecursiveDeref(dd, factorsNnv->h);
        Cudd_RecursiveDeref(dd, g1);
        if (freeNv) ABC_FREE(factorsNv);
        if (freeNnv) ABC_FREE(factorsNnv);
        return(NULL);
    }

    cuddRef(h1);

    g2 = cuddBddIteRecur(dd, topv, factorsNv->g, factorsNnv->h);
    if (g2 == NULL) {
        Cudd_RecursiveDeref(dd, factorsNv->h);
        Cudd_RecursiveDeref(dd, factorsNv->g);
        Cudd_RecursiveDeref(dd, factorsNnv->g);
        Cudd_RecursiveDeref(dd, factorsNnv->h);
        Cudd_RecursiveDeref(dd, g1);
        Cudd_RecursiveDeref(dd, h1);
        if (freeNv) ABC_FREE(factorsNv);
        if (freeNnv) ABC_FREE(factorsNnv);
        return(NULL);
    }
    cuddRef(g2);
    Cudd_RecursiveDeref(dd, factorsNv->g);
    Cudd_RecursiveDeref(dd, factorsNnv->h);

    h2 = cuddBddIteRecur(dd, topv, factorsNv->h, factorsNnv->g);
    if (h2 == NULL) {
        Cudd_RecursiveDeref(dd, factorsNv->g);
        Cudd_RecursiveDeref(dd, factorsNv->h);
        Cudd_RecursiveDeref(dd, factorsNnv->g);
        Cudd_RecursiveDeref(dd, factorsNnv->h);
        Cudd_RecursiveDeref(dd, g1);
        Cudd_RecursiveDeref(dd, h1);
        Cudd_RecursiveDeref(dd, g2);
        if (freeNv) ABC_FREE(factorsNv);
        if (freeNnv) ABC_FREE(factorsNnv);
        return(NULL);
    }
    cuddRef(h2);
    Cudd_RecursiveDeref(dd, factorsNv->h);
    Cudd_RecursiveDeref(dd, factorsNnv->g);
    if (freeNv) ABC_FREE(factorsNv);
    if (freeNnv) ABC_FREE(factorsNnv);

    /* check for each pair in tables and choose one */
    factors = CheckInTables(node, g1, h1, g2, h2, ghTable, cacheTable, &outOfMem);
    if (outOfMem) {
        dd->errorCode = CUDD_MEMORY_OUT;
        Cudd_RecursiveDeref(dd, g1);
        Cudd_RecursiveDeref(dd, h1);
        Cudd_RecursiveDeref(dd, g2);
        Cudd_RecursiveDeref(dd, h2);
        return(NULL);
    }
    if (factors != NULL) {
        if ((factors->g == g1) || (factors->g == h1)) {
            Cudd_RecursiveDeref(dd, g2);
            Cudd_RecursiveDeref(dd, h2);
        } else {
            Cudd_RecursiveDeref(dd, g1);
            Cudd_RecursiveDeref(dd, h1);
        }
        return(factors);
    }

    /* if not in tables, pick one pair */
    factors = PickOnePair(node,g1, h1, g2, h2, ghTable, cacheTable);
    if (factors == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        Cudd_RecursiveDeref(dd, g1);
        Cudd_RecursiveDeref(dd, h1);
        Cudd_RecursiveDeref(dd, g2);
        Cudd_RecursiveDeref(dd, h2);
    } else {
        /* now free what was created and not used */
        if ((factors->g == g1) || (factors->g == h1)) {
            Cudd_RecursiveDeref(dd, g2);
            Cudd_RecursiveDeref(dd, h2);
        } else {
            Cudd_RecursiveDeref(dd, g1);
            Cudd_RecursiveDeref(dd, h1);
        }
    }
        
    return(factors);
    
}